

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph
          (xmlSchemaBucketPtr_conflict bucket,xmlSchemaTypeType type,xmlChar *name,xmlChar *nsName)

{
  xmlSchemaItemListPtr pxVar1;
  xmlChar *pxVar2;
  xmlSchemaBucketPtr_conflict bucket_00;
  xmlSchemaBasicItemPtr pxVar3;
  long lVar4;
  xmlSchemaSchemaRelationPtr_conflict rel;
  xmlSchemaSchemaRelationPtr_conflict pxVar5;
  
  if (name != (xmlChar *)0x0 && bucket != (xmlSchemaBucketPtr_conflict)0x0) {
    pxVar1 = bucket->globals;
    if ((pxVar1 != (xmlSchemaItemListPtr)0x0) && (0 < (long)pxVar1->nbItems)) {
      lVar4 = 0;
      do {
        pxVar3 = (xmlSchemaBasicItemPtr)pxVar1->items[lVar4];
        if (pxVar3->type == type) {
          if (type - XML_SCHEMA_TYPE_SIMPLE < 2) {
            if (*(xmlChar **)(pxVar3 + 1) == name) {
              pxVar2 = *(xmlChar **)(pxVar3 + 0xd);
              goto joined_r0x001c38ed;
            }
          }
          else if (type == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
            if (*(xmlChar **)(pxVar3 + 1) == name) {
              pxVar2 = (xmlChar *)pxVar3[6].dummy;
              goto joined_r0x001c38ed;
            }
          }
          else {
            if (type != XML_SCHEMA_TYPE_GROUP) {
              return (xmlSchemaBasicItemPtr)0x0;
            }
            if (*(xmlChar **)(pxVar3 + 2) == name) {
              pxVar2 = (xmlChar *)pxVar3[2].dummy;
joined_r0x001c38ed:
              if (pxVar2 == nsName) {
                return pxVar3;
              }
            }
          }
        }
        lVar4 = lVar4 + 1;
      } while (pxVar1->nbItems != lVar4);
    }
    pxVar5 = bucket->relations;
    if (pxVar5 != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      *(byte *)&bucket->flags = (byte)bucket->flags | 1;
      do {
        bucket_00 = pxVar5->bucket;
        if (((bucket_00 != (xmlSchemaBucketPtr_conflict)0x0) && ((bucket_00->flags & 1) == 0)) &&
           (pxVar3 = xmlSchemaFindRedefCompInGraph(bucket_00,type,name,nsName),
           pxVar3 != (xmlSchemaBasicItemPtr)0x0)) {
          return pxVar3;
        }
        pxVar5 = pxVar5->next;
      } while (pxVar5 != (xmlSchemaSchemaRelationPtr)0x0);
      *(byte *)&bucket->flags = (byte)bucket->flags ^ 1;
    }
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph(xmlSchemaBucketPtr bucket,
			      xmlSchemaTypeType type,
			      const xmlChar *name,
			      const xmlChar *nsName)
{
    xmlSchemaBasicItemPtr ret;
    int i;

    if ((bucket == NULL) || (name == NULL))
	return(NULL);
    if ((bucket->globals == NULL) ||
	(bucket->globals->nbItems == 0))
	goto subschemas;
    /*
    * Search in global components.
    */
    for (i = 0; i < bucket->globals->nbItems; i++) {
	ret = bucket->globals->items[i];
	if (ret->type == type) {
	    switch (type) {
		case XML_SCHEMA_TYPE_COMPLEX:
		case XML_SCHEMA_TYPE_SIMPLE:
		    if ((WXS_COMP_NAME(ret, xmlSchemaTypePtr) == name) &&
			(WXS_COMP_TNS(ret, xmlSchemaTypePtr) ==
			nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaModelGroupDefPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaModelGroupDefPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaAttributeGroupPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaAttributeGroupPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		default:
		    /* Should not be hit. */
		    return(NULL);
	    }
	}
    }
subschemas:
    /*
    * Process imported/included schemas.
    */
    if (bucket->relations != NULL) {
	xmlSchemaSchemaRelationPtr rel = bucket->relations;

	/*
	* TODO: Marking the bucket will not avoid multiple searches
	* in the same schema, but avoids at least circularity.
	*/
	bucket->flags |= XML_SCHEMA_BUCKET_MARKED;
	do {
	    if ((rel->bucket != NULL) &&
		((rel->bucket->flags & XML_SCHEMA_BUCKET_MARKED) == 0)) {
		ret = xmlSchemaFindRedefCompInGraph(rel->bucket,
		    type, name, nsName);
		if (ret != NULL)
		    return(ret);
	    }
	    rel = rel->next;
	} while (rel != NULL);
	 bucket->flags ^= XML_SCHEMA_BUCKET_MARKED;
    }
    return(NULL);
}